

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O3

bool __thiscall
tinyusdz::tydra::ApplyToXformable
          (tydra *this,Stage *stage,Prim *prim,
          function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)> *fn)

{
  undefined1 uVar1;
  byte bVar2;
  GeomMesh *pGVar3;
  bool *this_00;
  GeomMesh *local_20;
  
  bVar2 = (byte)fn;
  this_00 = &(stage->stage_metas).upAxis._empty;
  local_20 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GPrim>((Value *)this_00,false);
  if ((((((local_20 == (GeomMesh *)0x0) &&
         (local_20 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::Xform>((Value *)this_00,false)
         , local_20 == (GeomMesh *)0x0)) &&
        (local_20 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>((Value *)this_00,false),
        local_20 == (GeomMesh *)0x0)) &&
       ((local_20 = (GeomMesh *)
                    tinyusdz::value::Value::as<tinyusdz::GeomSphere>((Value *)this_00,false),
        local_20 == (GeomMesh *)0x0 &&
        (local_20 = (GeomMesh *)
                    tinyusdz::value::Value::as<tinyusdz::GeomCapsule>((Value *)this_00,false),
        local_20 == (GeomMesh *)0x0)))) &&
      ((local_20 = (GeomMesh *)
                   tinyusdz::value::Value::as<tinyusdz::GeomCube>((Value *)this_00,false),
       local_20 == (GeomMesh *)0x0 &&
       ((local_20 = (GeomMesh *)
                    tinyusdz::value::Value::as<tinyusdz::GeomPoints>((Value *)this_00,false),
        local_20 == (GeomMesh *)0x0 &&
        (local_20 = (GeomMesh *)
                    tinyusdz::value::Value::as<tinyusdz::GeomCylinder>((Value *)this_00,false),
        local_20 == (GeomMesh *)0x0)))))) &&
     (local_20 = (GeomMesh *)
                 tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>((Value *)this_00,false),
     local_20 == (GeomMesh *)0x0)) {
    pGVar3 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::SkelRoot>((Value *)this_00,false);
    if (pGVar3 != (GeomMesh *)0x0) {
      local_20 = pGVar3;
      if ((prim->_abs_path)._prim_part.field_2._M_allocated_capacity == 0) goto LAB_005c5f04;
      bVar2 = (**(code **)((long)&(prim->_abs_path)._prim_part.field_2 + 8))(prim,this,&local_20);
    }
    return (bool)(pGVar3 != (GeomMesh *)0x0 & bVar2);
  }
  if ((prim->_abs_path)._prim_part.field_2._M_allocated_capacity != 0) {
    uVar1 = (**(code **)((long)&(prim->_abs_path)._prim_part.field_2 + 8))(prim,this,&local_20);
    return (bool)uVar1;
  }
LAB_005c5f04:
  ::std::__throw_bad_function_call();
}

Assistant:

bool ApplyToXformable(
  const Stage &stage, const Prim &prim,
  std::function<bool(const Stage &stage, const Xformable *xformable)> fn) {

  (void)stage;

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(stage, v); \
  } \
  }

  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(SkelRoot)

#undef APPLY_FUN

  return false;

}